

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_pool.h
# Opt level: O3

obj * __thiscall
VW::object_pool<obj,_obj_initializer>::get_object(object_pool<obj,_obj_initializer> *this)

{
  obj *poVar1;
  _Elt_pointer ppoVar2;
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_20;
  
  local_20._M_owns = false;
  local_20._M_device = &this->m_lock;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  ppoVar2 = (this->m_pool).c.super__Deque_base<obj_*,_std::allocator<obj_*>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  if ((this->m_pool).c.super__Deque_base<obj_*,_std::allocator<obj_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur == ppoVar2) {
    new_chunk(this,this->m_chunk_size);
    ppoVar2 = (this->m_pool).c.super__Deque_base<obj_*,_std::allocator<obj_*>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
  }
  poVar1 = *ppoVar2;
  std::deque<obj_*,_std::allocator<obj_*>_>::pop_front(&(this->m_pool).c);
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return poVar1;
}

Assistant:

T* get_object()
  {
    std::unique_lock<std::mutex> lock(m_lock);
    if (m_pool.empty())
    {
      new_chunk(m_chunk_size);
    }

    auto obj = m_pool.front();
    m_pool.pop();
    return obj;
  }